

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  byte bVar1;
  undefined2 uVar2;
  ulong uVar3;
  type pcVar4;
  char __tmp;
  ulong n;
  size_t __len;
  size_t __n;
  size_t __len_1;
  char *pcVar5;
  
  n = (ulong)spec->width_;
  uVar3 = 4 - (ulong)(f->sign == '\0');
  __n = n - uVar3;
  if (n < uVar3 || __n == 0) {
    pcVar4 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar3);
    if (f->sign != '\0') {
      *pcVar4 = f->sign;
      pcVar4 = pcVar4 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar4[2] = f->str[2];
    *(undefined2 *)pcVar4 = uVar2;
    return;
  }
  pcVar4 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                     ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,n);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar3 = __n >> 1 & 0x7fffffff;
    if (1 < __n) {
      memset(pcVar4,(uint)bVar1,uVar3);
      pcVar4 = pcVar4 + uVar3;
    }
    if (f->sign != '\0') {
      *pcVar4 = f->sign;
      pcVar4 = pcVar4 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar4[2] = f->str[2];
    *(undefined2 *)pcVar4 = uVar2;
    __n = __n - uVar3;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar5 = pcVar4 + __n;
      memset(pcVar4,(uint)bVar1,__n);
      if (f->sign != '\0') {
        *pcVar5 = f->sign;
        pcVar5 = pcVar5 + 1;
      }
      uVar2 = *(undefined2 *)f->str;
      pcVar5[2] = f->str[2];
      *(undefined2 *)pcVar5 = uVar2;
      return;
    }
    if (f->sign != '\0') {
      *pcVar4 = f->sign;
      pcVar4 = pcVar4 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar4[2] = f->str[2];
    *(undefined2 *)pcVar4 = uVar2;
  }
  memset(pcVar4 + 3,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }